

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvPostProcess.cpp
# Opt level: O2

void __thiscall spv::Builder::postProcessFeatures(Builder *this)

{
  _Rb_tree_header *p_Var1;
  Instruction *pIVar2;
  Function *pFVar3;
  Block *pBVar4;
  bool bVar5;
  uint uVar6;
  Id IVar7;
  Id IVar8;
  int iVar9;
  mapped_type *pmVar10;
  pointer ppFVar11;
  _Base_ptr p_Var12;
  iterator iVar13;
  pointer ppBVar14;
  size_t i_1;
  pointer puVar15;
  ulong uVar16;
  int i;
  int op;
  int t;
  long lVar17;
  Id id;
  vector<unsigned_int,_std::allocator<unsigned_int>_> workgroup_variables;
  
  lVar17 = 0;
  do {
    workgroup_variables.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(workgroup_variables.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start._4_4_,0x20);
    pmVar10 = std::__detail::
              _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&this->groupedTypes,(key_type *)&workgroup_variables);
    if ((int)((ulong)((long)(pmVar10->
                            super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                     (long)(pmVar10->
                           super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>
                           )._M_impl.super__Vector_impl_data._M_start) >> 3) <= lVar17) {
      ppFVar11 = (this->module).functions.
                 super__Vector_base<spv::Function_*,_std::allocator<spv::Function_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      do {
        if (ppFVar11 ==
            (this->module).functions.
            super__Vector_base<spv::Function_*,_std::allocator<spv::Function_*>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          workgroup_variables.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_start =
               (pointer)CONCAT44(workgroup_variables.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,0x14e1);
          iVar13 = std::
                   _Rb_tree<spv::Capability,_spv::Capability,_std::_Identity<spv::Capability>,_std::less<spv::Capability>,_std::allocator<spv::Capability>_>
                   ::find(&(this->capabilities)._M_t,(key_type *)&workgroup_variables);
          p_Var1 = &(this->capabilities)._M_t._M_impl.super__Rb_tree_header;
          if ((_Rb_tree_header *)iVar13._M_node != p_Var1) {
            this->memoryModel = MemoryModelVulkan;
            addIncorporatedExtension(this,"SPV_KHR_vulkan_memory_model",Spv_1_5);
          }
          workgroup_variables.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_start =
               (pointer)CONCAT44(workgroup_variables.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,0x114c);
          iVar13 = std::
                   _Rb_tree<spv::Capability,_spv::Capability,_std::_Identity<spv::Capability>,_std::less<spv::Capability>,_std::allocator<spv::Capability>_>
                   ::find(&(this->capabilities)._M_t,(key_type *)&workgroup_variables);
          if ((_Rb_tree_header *)iVar13._M_node != p_Var1) {
            puVar15 = (this->entryPoints).
                      super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if ((long)(this->entryPoints).
                      super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)puVar15 != 8) {
              __assert_fail("entryPoints.size() == 1",
                            "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvPostProcess.cpp"
                            ,0x1d0,"void spv::Builder::postProcessFeatures()");
            }
            workgroup_variables.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            workgroup_variables.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            workgroup_variables.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            op = 0;
            while( true ) {
              iVar9 = Instruction::getNumOperands
                                ((Instruction *)
                                 (puVar15->_M_t).
                                 super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                                 ._M_t);
              if (iVar9 <= op) break;
              bVar5 = Instruction::isIdOperand
                                ((Instruction *)
                                 (puVar15->_M_t).
                                 super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                                 ._M_t,op);
              if (bVar5) {
                id = Instruction::getIdOperand
                               ((Instruction *)
                                (puVar15->_M_t).
                                super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                                ._M_t,op);
                pIVar2 = (this->module).idToInstruction.
                         super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>
                         ._M_impl.super__Vector_impl_data._M_start[id];
                if (pIVar2->opCode == OpVariable) {
                  uVar6 = Instruction::getImmediateOperand(pIVar2,0);
                  if (uVar6 == 4) {
                    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                              (&workgroup_variables,&id);
                  }
                }
              }
              op = op + 1;
            }
            if (4 < (ulong)((long)workgroup_variables.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)workgroup_variables.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start)) {
              for (uVar16 = 0;
                  uVar16 < (ulong)((long)workgroup_variables.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)workgroup_variables.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 2);
                  uVar16 = uVar16 + 1) {
                addDecoration(this,workgroup_variables.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start[uVar16],Aliased,-1);
              }
            }
            std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                      (&workgroup_variables.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
          }
          return;
        }
        pFVar3 = *ppFVar11;
        for (ppBVar14 = (pFVar3->blocks).
                        super__Vector_base<spv::Block_*,_std::allocator<spv::Block_*>_>._M_impl.
                        super__Vector_impl_data._M_start;
            ppBVar14 !=
            (pFVar3->blocks).super__Vector_base<spv::Block_*,_std::allocator<spv::Block_*>_>._M_impl
            .super__Vector_impl_data._M_finish; ppBVar14 = ppBVar14 + 1) {
          pBVar4 = *ppBVar14;
          for (puVar15 = (pBVar4->instructions).
                         super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
              puVar15 !=
              (pBVar4->instructions).
              super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish; puVar15 = puVar15 + 1) {
            postProcess(this,(puVar15->_M_t).
                             super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                             .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl);
          }
          for (puVar15 = (pBVar4->localVariables).
                         super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
              puVar15 !=
              (pBVar4->localVariables).
              super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish; puVar15 = puVar15 + 1) {
            IVar7 = ((puVar15->_M_t).
                     super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                     .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl)->resultId;
            IVar8 = getDerefTypeId(this,IVar7);
            bVar5 = containsPhysicalStorageBufferOrArray(this,IVar8);
            if (bVar5) {
              bVar5 = false;
              for (p_Var12 = (this->decorations)._M_t._M_impl.super__Rb_tree_header._M_header.
                             _M_left;
                  (_Rb_tree_header *)p_Var12 !=
                  &(this->decorations)._M_t._M_impl.super__Rb_tree_header;
                  p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12)) {
                IVar8 = Instruction::getIdOperand(*(Instruction **)(p_Var12 + 1),0);
                if ((IVar8 == IVar7) && ((*(Instruction **)(p_Var12 + 1))->opCode == OpDecorate)) {
                  uVar6 = Instruction::getImmediateOperand(*(Instruction **)(p_Var12 + 1),1);
                  if (uVar6 != 0x14ec) {
                    uVar6 = Instruction::getImmediateOperand(*(Instruction **)(p_Var12 + 1),1);
                    if (uVar6 != 0x14eb) goto LAB_00368713;
                  }
                  bVar5 = true;
                }
LAB_00368713:
              }
              if (!bVar5) {
                addDecoration(this,IVar7,AliasedPointer,-1);
              }
            }
          }
        }
        ppFVar11 = ppFVar11 + 1;
      } while( true );
    }
    workgroup_variables.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(workgroup_variables.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start._4_4_,0x20);
    pmVar10 = std::__detail::
              _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&this->groupedTypes,(key_type *)&workgroup_variables);
    pIVar2 = (pmVar10->super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>).
             _M_impl.super__Vector_impl_data._M_start[lVar17];
    uVar6 = Instruction::getImmediateOperand(pIVar2,0);
    if (uVar6 == 0x14e5) {
      IVar7 = Instruction::getIdOperand(pIVar2,1);
      bVar5 = containsType(this,IVar7,OpTypeInt,8);
      if (bVar5) {
        addIncorporatedExtension(this,"SPV_KHR_8bit_storage",Spv_1_5);
        addCapability(this,CapabilityStorageBuffer8BitAccess);
      }
      IVar7 = Instruction::getIdOperand(pIVar2,1);
      bVar5 = containsType(this,IVar7,OpTypeInt,0x10);
      if (!bVar5) {
        IVar7 = Instruction::getIdOperand(pIVar2,1);
        bVar5 = containsType(this,IVar7,OpTypeFloat,0x10);
        if (!bVar5) goto LAB_00368614;
      }
      addIncorporatedExtension(this,"SPV_KHR_16bit_storage",Spv_1_3);
      addCapability(this,CapabilityStorageBuffer16BitAccess);
    }
LAB_00368614:
    lVar17 = lVar17 + 1;
  } while( true );
}

Assistant:

void Builder::postProcessFeatures() {
    // Add per-instruction capabilities, extensions, etc.,

    // Look for any 8/16 bit type in physical storage buffer class, and set the
    // appropriate capability. This happens in createSpvVariable for other storage
    // classes, but there isn't always a variable for physical storage buffer.
    for (int t = 0; t < (int)groupedTypes[OpTypePointer].size(); ++t) {
        Instruction* type = groupedTypes[OpTypePointer][t];
        if (type->getImmediateOperand(0) == (unsigned)StorageClassPhysicalStorageBufferEXT) {
            if (containsType(type->getIdOperand(1), OpTypeInt, 8)) {
                addIncorporatedExtension(spv::E_SPV_KHR_8bit_storage, spv::Spv_1_5);
                addCapability(spv::CapabilityStorageBuffer8BitAccess);
            }
            if (containsType(type->getIdOperand(1), OpTypeInt, 16) ||
                containsType(type->getIdOperand(1), OpTypeFloat, 16)) {
                addIncorporatedExtension(spv::E_SPV_KHR_16bit_storage, spv::Spv_1_3);
                addCapability(spv::CapabilityStorageBuffer16BitAccess);
            }
        }
    }

    // process all block-contained instructions
    for (auto fi = module.getFunctions().cbegin(); fi != module.getFunctions().cend(); fi++) {
        Function* f = *fi;
        for (auto bi = f->getBlocks().cbegin(); bi != f->getBlocks().cend(); bi++) {
            Block* b = *bi;
            for (auto ii = b->getInstructions().cbegin(); ii != b->getInstructions().cend(); ii++)
                postProcess(*ii->get());

            // For all local variables that contain pointers to PhysicalStorageBufferEXT, check whether
            // there is an existing restrict/aliased decoration. If we don't find one, add Aliased as the
            // default.
            for (auto vi = b->getLocalVariables().cbegin(); vi != b->getLocalVariables().cend(); vi++) {
                const Instruction& inst = *vi->get();
                Id resultId = inst.getResultId();
                if (containsPhysicalStorageBufferOrArray(getDerefTypeId(resultId))) {
                    bool foundDecoration = false;
                    const auto function = [&](const std::unique_ptr<Instruction>& decoration) {
                        if (decoration.get()->getIdOperand(0) == resultId &&
                            decoration.get()->getOpCode() == OpDecorate &&
                            (decoration.get()->getImmediateOperand(1) == spv::DecorationAliasedPointerEXT ||
                             decoration.get()->getImmediateOperand(1) == spv::DecorationRestrictPointerEXT)) {
                            foundDecoration = true;
                        }
                    };
                    std::for_each(decorations.begin(), decorations.end(), function);
                    if (!foundDecoration) {
                        addDecoration(resultId, spv::DecorationAliasedPointerEXT);
                    }
                }
            }
        }
    }

    // If any Vulkan memory model-specific functionality is used, update the
    // OpMemoryModel to match.
    if (capabilities.find(spv::CapabilityVulkanMemoryModelKHR) != capabilities.end()) {
        memoryModel = spv::MemoryModelVulkanKHR;
        addIncorporatedExtension(spv::E_SPV_KHR_vulkan_memory_model, spv::Spv_1_5);
    }

    // Add Aliased decoration if there's more than one Workgroup Block variable.
    if (capabilities.find(spv::CapabilityWorkgroupMemoryExplicitLayoutKHR) != capabilities.end()) {
        assert(entryPoints.size() == 1);
        auto &ep = entryPoints[0];

        std::vector<Id> workgroup_variables;
        for (int i = 0; i < (int)ep->getNumOperands(); i++) {
            if (!ep->isIdOperand(i))
                continue;

            const Id id = ep->getIdOperand(i);
            const Instruction *instr = module.getInstruction(id);
            if (instr->getOpCode() != spv::OpVariable)
                continue;

            if (instr->getImmediateOperand(0) == spv::StorageClassWorkgroup)
                workgroup_variables.push_back(id);
        }

        if (workgroup_variables.size() > 1) {
            for (size_t i = 0; i < workgroup_variables.size(); i++)
                addDecoration(workgroup_variables[i], spv::DecorationAliased);
        }
    }
}